

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

bool Js::RegexHelper::GetFlags
               (ScriptContext *scriptContext,char16 *str,CharCount strLen,RegexFlags *flags)

{
  bool bVar1;
  ScriptConfiguration *pSVar2;
  uint local_34;
  CharCount i;
  RegexFlags *flags_local;
  CharCount strLen_local;
  char16 *str_local;
  ScriptContext *scriptContext_local;
  
  local_34 = 0;
  do {
    if (strLen <= local_34) {
      return true;
    }
    switch(str[local_34]) {
    case L'g':
      if ((*flags & GlobalRegexFlag) != NoRegexFlags) {
        return false;
      }
      *flags = *flags | GlobalRegexFlag;
      break;
    default:
      return false;
    case L'i':
      if ((*flags & IgnoreCaseRegexFlag) != NoRegexFlags) {
        return false;
      }
      *flags = *flags | IgnoreCaseRegexFlag;
      break;
    case L'm':
      if ((*flags & MultilineRegexFlag) != NoRegexFlags) {
        return false;
      }
      *flags = *flags | MultilineRegexFlag;
      break;
    case L's':
      pSVar2 = ScriptContext::GetConfig(scriptContext);
      bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(pSVar2);
      if (!bVar1) {
        return false;
      }
      if ((*flags & DotAllRegexFlag) != NoRegexFlags) {
        return false;
      }
      *flags = *flags | DotAllRegexFlag;
      break;
    case L'u':
      pSVar2 = ScriptContext::GetConfig(scriptContext);
      bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(pSVar2);
      if (!bVar1) {
        return false;
      }
      if ((*flags & UnicodeRegexFlag) != NoRegexFlags) {
        return false;
      }
      *flags = *flags | UnicodeRegexFlag;
      break;
    case L'y':
      pSVar2 = ScriptContext::GetConfig(scriptContext);
      bVar1 = ScriptConfiguration::IsES6RegExStickyEnabled(pSVar2);
      if (!bVar1) {
        return false;
      }
      if ((*flags & StickyRegexFlag) != NoRegexFlags) {
        return false;
      }
      *flags = *flags | StickyRegexFlag;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool RegexHelper::GetFlags(Js::ScriptContext* scriptContext, __in_ecount(strLen) const char16* str, CharCount strLen, UnifiedRegex::RegexFlags &flags)
    {
        for (CharCount i = 0; i < strLen; i++)
        {
            switch (str[i])
            {
            case 'i':
                if ((flags & UnifiedRegex::IgnoreCaseRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & UnifiedRegex::GlobalRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & UnifiedRegex::MultilineRegexFlag) != 0)
                    return false;
                flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & UnifiedRegex::DotAllRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::DotAllRegexFlag);
                    break;
                }
                return false;
            case 'u':
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if((flags & UnifiedRegex::UnicodeRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::UnicodeRegexFlag);
                    break;
                }
                return false;
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & UnifiedRegex::StickyRegexFlag) != 0)
                        return false;
                    flags = (UnifiedRegex::RegexFlags)(flags | UnifiedRegex::StickyRegexFlag);
                    break;
                }
                return false;
            default:
                return false;
            }
        }

        return true;
    }